

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketExists_WriteSocketErased::
~TestUnsignal_SocketExists_WriteSocketErased(TestUnsignal_SocketExists_WriteSocketErased *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(Unsignal_SocketExists_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addWrite(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}